

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

ImplementsClauseSyntax * __thiscall
slang::parsing::Parser::parseImplementsClause(Parser *this,TokenKind keywordKind,Token *semi)

{
  bool bVar1;
  int iVar2;
  SourceLocation location;
  NameSyntax *pNVar3;
  undefined4 extraout_var;
  ImplementsClauseSyntax *pIVar4;
  Info *src;
  Info *extraout_RDX;
  Token TVar5;
  Token TVar6;
  Token TVar7;
  Token local_148;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_138;
  uint local_128;
  undefined8 local_118;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,keywordKind);
  if (!bVar1) {
    TVar5 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    *semi = TVar5;
    return (ImplementsClauseSyntax *)0x0;
  }
  TVar5 = ParserBase::consume(&this->super_ParserBase);
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
       (pointer)buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 8;
  TVar6 = ParserBase::peek(&this->super_ParserBase);
  local_148 = TVar6;
  bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar6.kind);
  if (bVar1) {
    location = Token::location(&local_148);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x340005,location);
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(TVar6.kind);
    if (!bVar1) {
      ParserBase::reportMissingList(&this->super_ParserBase,TVar6,Semicolon,semi,(DiagCode)0x340005)
      ;
      src = extraout_RDX;
      goto LAB_002bb547;
    }
    do {
      TVar6 = ParserBase::peek(&this->super_ParserBase);
      pNVar3 = parseName(this);
      local_138._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pNVar3;
      local_128 = CONCAT31(local_128._1_3_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                 (TokenOrSyntax *)&local_138._M_first);
      TVar7 = ParserBase::peek(&this->super_ParserBase);
      bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar7.kind);
      if ((bVar1) || (bVar1 = ParserBase::peek(&this->super_ParserBase,Comma), !bVar1)) break;
      local_138._M_first._M_storage =
           (_Uninitialized<slang::parsing::Token,_true>)
           ParserBase::expect(&this->super_ParserBase,Comma);
      local_128 = local_128 & 0xffffff00;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                 (TokenOrSyntax *)&local_138._M_first);
      TVar7 = ParserBase::peek(&this->super_ParserBase);
      bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar7.kind);
      if (bVar1) {
        ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
        break;
      }
      TVar7 = ParserBase::peek(&this->super_ParserBase);
    } while ((TVar6.info != TVar7.info || TVar6.kind != TVar7.kind) ||
            (bVar1 = ParserBase::
                     skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isSemicolon>
                               (&this->super_ParserBase,(DiagCode)0x340005,true), bVar1));
  }
  TVar6 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  src = TVar6.info;
  *semi = TVar6;
LAB_002bb547:
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  local_118 = CONCAT44(extraout_var,iVar2);
  local_128 = 3;
  local_138 = (_Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>)
              ZEXT816(0x472e50);
  pIVar4 = slang::syntax::SyntaxFactory::implementsClause
                     (&this->factory,TVar5,
                      (SeparatedSyntaxList<slang::syntax::NameSyntax> *)&local_138._M_first);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::~SmallVectorBase
            (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>);
  return pIVar4;
}

Assistant:

ImplementsClauseSyntax* Parser::parseImplementsClause(TokenKind keywordKind, Token& semi) {
    if (!peek(keywordKind)) {
        semi = expect(TokenKind::Semicolon);
        return nullptr;
    }

    auto implements = consume();
    SmallVector<TokenOrSyntax, 8> buffer;
    parseList<isPossibleExpressionOrComma, isSemicolon>(buffer, TokenKind::Semicolon,
                                                        TokenKind::Comma, semi, RequireItems::True,
                                                        diag::ExpectedInterfaceClassName,
                                                        [this] { return &parseName(); });

    return &factory.implementsClause(implements, buffer.copy(alloc));
}